

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# huffman.c
# Opt level: O3

void BZ2_hbCreateDecodeTables
               (Int32 *limit,Int32 *base,Int32 *perm,UChar *length,Int32 minLen,Int32 maxLen,
               Int32 alphaSize)

{
  int iVar1;
  int iVar2;
  long lVar3;
  uint uVar4;
  int iVar5;
  ulong uVar6;
  bool bVar7;
  
  if (minLen <= maxLen) {
    iVar5 = 0;
    uVar4 = minLen;
    do {
      if (0 < alphaSize) {
        uVar6 = 0;
        do {
          if (uVar4 == length[uVar6]) {
            perm[iVar5] = (Int32)uVar6;
            iVar5 = iVar5 + 1;
          }
          uVar6 = uVar6 + 1;
        } while ((uint)alphaSize != uVar6);
      }
      bVar7 = uVar4 != maxLen;
      uVar4 = uVar4 + 1;
    } while (bVar7);
  }
  base[0x13] = 0;
  base[0x14] = 0;
  base[0x15] = 0;
  base[0x16] = 0;
  base[0x10] = 0;
  base[0x11] = 0;
  base[0x12] = 0;
  base[0x13] = 0;
  base[0xc] = 0;
  base[0xd] = 0;
  base[0xe] = 0;
  base[0xf] = 0;
  base[8] = 0;
  base[9] = 0;
  base[10] = 0;
  base[0xb] = 0;
  base[4] = 0;
  base[5] = 0;
  base[6] = 0;
  base[7] = 0;
  base[0] = 0;
  base[1] = 0;
  base[2] = 0;
  base[3] = 0;
  if (0 < alphaSize) {
    uVar6 = 0;
    do {
      base[(ulong)length[uVar6] + 1] = base[(ulong)length[uVar6] + 1] + 1;
      uVar6 = uVar6 + 1;
    } while ((uint)alphaSize != uVar6);
  }
  iVar5 = *base;
  lVar3 = 1;
  do {
    iVar5 = iVar5 + base[lVar3];
    base[lVar3] = iVar5;
    lVar3 = lVar3 + 1;
  } while (lVar3 != 0x17);
  limit[0x13] = 0;
  limit[0x14] = 0;
  limit[0x15] = 0;
  limit[0x16] = 0;
  limit[0x10] = 0;
  limit[0x11] = 0;
  limit[0x12] = 0;
  limit[0x13] = 0;
  limit[0xc] = 0;
  limit[0xd] = 0;
  limit[0xe] = 0;
  limit[0xf] = 0;
  limit[8] = 0;
  limit[9] = 0;
  limit[10] = 0;
  limit[0xb] = 0;
  limit[4] = 0;
  limit[5] = 0;
  limit[6] = 0;
  limit[7] = 0;
  limit[0] = 0;
  limit[1] = 0;
  limit[2] = 0;
  limit[3] = 0;
  if (minLen <= maxLen) {
    lVar3 = 0;
    iVar5 = 0;
    do {
      iVar1 = base[(long)minLen + lVar3 + 1];
      iVar2 = base[minLen + lVar3];
      limit[minLen + lVar3] = (iVar1 - iVar2) + iVar5 + -1;
      iVar5 = (iVar5 + (iVar1 - iVar2)) * 2;
      lVar3 = lVar3 + 1;
    } while ((maxLen - minLen) + 1 != (int)lVar3);
  }
  if (minLen < maxLen) {
    lVar3 = (long)minLen;
    do {
      base[lVar3 + 1] = (limit[lVar3] * 2 - base[lVar3 + 1]) + 2;
      lVar3 = lVar3 + 1;
    } while (maxLen != lVar3);
  }
  return;
}

Assistant:

void BZ2_hbCreateDecodeTables ( Int32 *limit,
                                Int32 *base,
                                Int32 *perm,
                                UChar *length,
                                Int32 minLen,
                                Int32 maxLen,
                                Int32 alphaSize )
{
   Int32 pp, i, j, vec;

   pp = 0;
   for (i = minLen; i <= maxLen; i++)
      for (j = 0; j < alphaSize; j++)
         if (length[j] == i) { perm[pp] = j; pp++; };

   for (i = 0; i < BZ_MAX_CODE_LEN; i++) base[i] = 0;
   for (i = 0; i < alphaSize; i++) base[length[i]+1]++;

   for (i = 1; i < BZ_MAX_CODE_LEN; i++) base[i] += base[i-1];

   for (i = 0; i < BZ_MAX_CODE_LEN; i++) limit[i] = 0;
   vec = 0;

   for (i = minLen; i <= maxLen; i++) {
      vec += (base[i+1] - base[i]);
      limit[i] = vec-1;
      vec <<= 1;
   }
   for (i = minLen + 1; i <= maxLen; i++)
      base[i] = ((limit[i-1] + 1) << 1) - base[i];
}